

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xpath_query::xpath_query(xpath_query *this,xpath_query *rhs)

{
  ptrdiff_t pVar1;
  xpath_parse_result local_28;
  xpath_query *local_18;
  xpath_query *rhs_local;
  xpath_query *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  xpath_parse_result::xpath_parse_result(&this->_result);
  this->_impl = local_18->_impl;
  pVar1 = (local_18->_result).offset;
  (this->_result).error = (local_18->_result).error;
  (this->_result).offset = pVar1;
  local_18->_impl = (void *)0x0;
  xpath_parse_result::xpath_parse_result(&local_28);
  (local_18->_result).error = local_28.error;
  (local_18->_result).offset = local_28.offset;
  return;
}

Assistant:

PUGI__FN xpath_query::xpath_query(xpath_query&& rhs) PUGIXML_NOEXCEPT
	{
		_impl = rhs._impl;
		_result = rhs._result;
		rhs._impl = 0;
		rhs._result = xpath_parse_result();
	}